

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void jx9_context_free_chunk(jx9_context *pCtx,void *pChunk)

{
  long *plVar1;
  ulong uVar2;
  
  if (pChunk == (void *)0x0) {
    return;
  }
  uVar2 = (ulong)(pCtx->sChunk).nUsed;
  if (uVar2 != 0) {
    plVar1 = (long *)(pCtx->sChunk).pBase;
    do {
      if ((void *)*plVar1 == pChunk) goto LAB_0010d79f;
      plVar1 = plVar1 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  plVar1 = (long *)0x0;
LAB_0010d79f:
  if (plVar1 != (long *)0x0) {
    *plVar1 = 0;
  }
  SyMemBackendFree(&pCtx->pVm->sAllocator,pChunk);
  return;
}

Assistant:

JX9_PRIVATE void jx9_context_free_chunk(jx9_context *pCtx, void *pChunk)
{
	jx9_aux_data *pAux;
	if( pChunk == 0 ){
		/* TICKET-1433-93: NULL chunk is a harmless operation */
		return;
	}
	pAux = ContextFindChunk(pCtx, pChunk);
	if( pAux ){
		/* Mark as destroyed */
		pAux->pAuxData = 0;
	}
	SyMemBackendFree(&pCtx->pVm->sAllocator, pChunk);
}